

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

size_t __thiscall google::protobuf::internal::ExtensionSet::ByteSize(ExtensionSet *this)

{
  uint16_t uVar1;
  size_t sVar2;
  KeyValue *pKVar3;
  size_t sVar4;
  KeyValue *pKVar5;
  size_t local_20;
  
  local_20 = 0;
  uVar1 = this->flat_size_;
  pKVar3 = (this->map_).flat;
  if ((long)(short)uVar1 < 0) {
    ForEach<std::_Rb_tree_iterator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,google::protobuf::internal::ExtensionSet::ByteSize()const::__0>
              ((_Base_ptr)(pKVar3->second).descriptor,
               (_Rb_tree_iterator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                )&pKVar3->second,(anon_class_8_1_736c71da)&local_20);
    sVar4 = local_20;
  }
  else if (uVar1 == 0) {
    sVar4 = 0;
  }
  else {
    pKVar5 = pKVar3 + (short)uVar1;
    sVar4 = 0;
    do {
      sVar2 = Extension::ByteSize(&pKVar3->second,pKVar3->first);
      sVar4 = sVar4 + sVar2;
      pKVar3 = pKVar3 + 1;
    } while (pKVar3 != pKVar5);
  }
  return sVar4;
}

Assistant:

size_t ExtensionSet::ByteSize() const {
  size_t total_size = 0;
  ForEach([&total_size](int number, const Extension& ext) {
    total_size += ext.ByteSize(number);
  });
  return total_size;
}